

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlResponsePoller.cpp
# Opt level: O2

int __thiscall
aeron::archive::ControlResponsePoller::poll
          (ControlResponsePoller *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  int iVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  *(undefined4 *)&this->relevantId_ = 0xffffffff;
  *(undefined4 *)((long)&this->relevantId_ + 4) = 0xffffffff;
  *(undefined4 *)&this->templateId_ = 0xffffffff;
  *(undefined4 *)((long)&this->templateId_ + 4) = 0xffffffff;
  *(undefined4 *)&this->controlSessionId_ = 0xffffffff;
  *(undefined4 *)((long)&this->controlSessionId_ + 4) = 0xffffffff;
  *(undefined4 *)&this->correlationId_ = 0xffffffff;
  *(undefined4 *)((long)&this->correlationId_ + 4) = 0xffffffff;
  this->isPollComplete_ = false;
  local_28._8_8_ = 0;
  local_28._M_unused._M_object = &this->fragmentAssembler_;
  local_10 = std::
             _Function_handler<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ControlledFragmentAssembler.h:64:16)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ControlledFragmentAssembler.h:64:16)>
             ::_M_manager;
  iVar1 = Subscription::
          controlledPoll<std::function<aeron::ControlledPollAction(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>>
                    ((this->subscription_).
                     super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (function<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
                      *)&local_28,this->fragmentLimit_);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return iVar1;
}

Assistant:

std::int32_t ControlResponsePoller::poll() {
    controlSessionId_ = -1;
    correlationId_ = -1;
    relevantId_ = -1;
    templateId_ = -1;
    isPollComplete_ = false;

    return subscription_->controlledPoll(fragmentAssembler_.handler(), fragmentLimit_);
}